

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_new.c
# Opt level: O1

LY_ERR lyd_new_opaq(lyd_node *parent,ly_ctx *ctx,char *name,char *value,char *prefix,
                   char *module_name,lyd_node **node)

{
  lysc_node *plVar1;
  ly_ctx *plVar2;
  int iVar3;
  LY_ERR LVar4;
  lys_module *plVar5;
  size_t value_len;
  char *pcVar6;
  lyd_node *ret;
  size_t local_50;
  long local_48;
  size_t local_40;
  size_t local_38;
  
  ret = (lyd_node *)0x0;
  if (parent == (lyd_node *)0x0 && ctx == (ly_ctx *)0x0) {
    pcVar6 = "parent || ctx";
    ctx = (ly_ctx *)0x0;
  }
  else if (parent == (lyd_node *)0x0 && node == (lyd_node **)0x0) {
    pcVar6 = "parent || node";
  }
  else if (name == (char *)0x0) {
    pcVar6 = "name";
  }
  else if (module_name == (char *)0x0) {
    pcVar6 = "module_name";
  }
  else {
    if ((prefix == (char *)0x0) || (iVar3 = strcmp(prefix,module_name), iVar3 == 0)) {
      if (parent != (lyd_node *)0x0 && ctx != (ly_ctx *)0x0) {
        plVar1 = parent->schema;
        if (plVar1 == (lysc_node *)0x0) {
          plVar2 = (ly_ctx *)parent[2].schema;
        }
        else {
          plVar2 = plVar1->module->ctx;
        }
        if (plVar2 != (ly_ctx *)0x0) {
          if (plVar1 == (lysc_node *)0x0) {
            plVar5 = (lys_module *)&parent[2].schema;
          }
          else {
            plVar5 = plVar1->module;
          }
          if (plVar5->ctx != ctx) {
            ly_log(ctx,LY_LLERR,LY_EINVAL,"Different contexts mixed in a single function call.");
            return LY_EINVAL;
          }
        }
      }
      if (ctx == (ly_ctx *)0x0) {
        if (parent->schema == (lysc_node *)0x0) {
          plVar5 = (lys_module *)&parent[2].schema;
        }
        else {
          plVar5 = parent->schema->module;
        }
        ctx = plVar5->ctx;
      }
      if (value == (char *)0x0) {
        local_48 = 0;
        value = "";
      }
      else {
        iVar3 = strcmp(value,"[null]");
        local_48 = (ulong)(iVar3 == 0) << 6;
      }
      local_38 = strlen(name);
      if (prefix == (char *)0x0) {
        local_50 = 0;
      }
      else {
        local_50 = strlen(prefix);
      }
      local_40 = strlen(module_name);
      value_len = strlen(value);
      LVar4 = lyd_create_opaq(ctx,name,local_38,prefix,local_50,module_name,local_40,value,value_len
                              ,(ly_bool *)0x0,LY_VALUE_JSON,(void *)0x0,(uint32_t)local_48,&ret);
      if (LVar4 != LY_SUCCESS) {
        return LVar4;
      }
      if (parent != (lyd_node *)0x0) {
        lyd_insert_node(parent,(lyd_node **)0x0,ret,1);
      }
      if (node == (lyd_node **)0x0) {
        return LY_SUCCESS;
      }
      *node = ret;
      return LY_SUCCESS;
    }
    pcVar6 = "!prefix || !strcmp(prefix, module_name)";
  }
  ly_log(ctx,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar6,"lyd_new_opaq");
  return LY_EINVAL;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_new_opaq(struct lyd_node *parent, const struct ly_ctx *ctx, const char *name, const char *value,
        const char *prefix, const char *module_name, struct lyd_node **node)
{
    struct lyd_node *ret = NULL;
    uint32_t hints = 0;

    LY_CHECK_ARG_RET(ctx, parent || ctx, parent || node, name, module_name, !prefix || !strcmp(prefix, module_name), LY_EINVAL);
    LY_CHECK_CTX_EQUAL_RET(ctx, parent ? LYD_CTX(parent) : NULL, LY_EINVAL);

    if (!ctx) {
        ctx = LYD_CTX(parent);
    }
    if (!value) {
        value = "";
    } else if (!strcmp(value, "[null]")) {
        hints |= LYD_VALHINT_EMPTY;
    }

    LY_CHECK_RET(lyd_create_opaq(ctx, name, strlen(name), prefix, prefix ? strlen(prefix) : 0, module_name,
            strlen(module_name), value, strlen(value), NULL, LY_VALUE_JSON, NULL, hints, &ret));
    if (parent) {
        lyd_insert_node(parent, NULL, ret, LYD_INSERT_NODE_LAST);
    }

    if (node) {
        *node = ret;
    }
    return LY_SUCCESS;
}